

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

void __thiscall ON_RevSurface::ON_RevSurface(ON_RevSurface *this,ON_RevSurface *src)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_Curve *pOVar6;
  
  ON_Surface::ON_Surface(&this->super_ON_Surface,&src->super_ON_Surface);
  (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_0082b358;
  ON_Line::ON_Line(&this->m_axis);
  ON_Interval::ON_Interval(&this->m_angle);
  ON_Interval::ON_Interval(&this->m_t);
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  if (m_s_ON_RevSurface_ptr != (void *)0x0) {
    (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
         (_func_int **)m_s_ON_RevSurface_ptr;
  }
  if (src->m_curve == (ON_Curve *)0x0) {
    pOVar6 = (ON_Curve *)0x0;
  }
  else {
    pOVar6 = ON_Curve::Duplicate(src->m_curve);
  }
  this->m_curve = pOVar6;
  dVar1 = (src->m_axis).from.x;
  dVar2 = (src->m_axis).from.y;
  dVar3 = (src->m_axis).from.z;
  dVar4 = (src->m_axis).to.x;
  dVar5 = (src->m_axis).to.z;
  (this->m_axis).to.y = (src->m_axis).to.y;
  (this->m_axis).to.z = dVar5;
  (this->m_axis).from.z = dVar3;
  (this->m_axis).to.x = dVar4;
  (this->m_axis).from.x = dVar1;
  (this->m_axis).from.y = dVar2;
  dVar1 = (src->m_angle).m_t[1];
  (this->m_angle).m_t[0] = (src->m_angle).m_t[0];
  (this->m_angle).m_t[1] = dVar1;
  dVar1 = (src->m_t).m_t[1];
  (this->m_t).m_t[0] = (src->m_t).m_t[0];
  (this->m_t).m_t[1] = dVar1;
  this->m_bTransposed = src->m_bTransposed;
  dVar1 = (src->m_bbox).m_min.x;
  dVar2 = (src->m_bbox).m_min.y;
  dVar3 = (src->m_bbox).m_min.z;
  dVar4 = (src->m_bbox).m_max.x;
  dVar5 = (src->m_bbox).m_max.z;
  (this->m_bbox).m_max.y = (src->m_bbox).m_max.y;
  (this->m_bbox).m_max.z = dVar5;
  (this->m_bbox).m_min.z = dVar3;
  (this->m_bbox).m_max.x = dVar4;
  (this->m_bbox).m_min.x = dVar1;
  (this->m_bbox).m_min.y = dVar2;
  return;
}

Assistant:

ON_RevSurface::ON_RevSurface( const ON_RevSurface& src ) : ON_Surface(src)
{
  ON__SET__THIS__PTR(m_s_ON_RevSurface_ptr);
  m_curve = src.m_curve ? src.m_curve->Duplicate() : nullptr;
  m_axis = src.m_axis;
  m_angle = src.m_angle;
  m_t = src.m_t;
  m_bTransposed = src.m_bTransposed;
  m_bbox = src.m_bbox;
}